

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBucket.cpp
# Opt level: O0

LargeHeapBlock * __thiscall
Memory::LargeHeapBucket::AddLargeHeapBlock(LargeHeapBucket *this,size_t size,bool nothrow)

{
  HeapInfo *pHVar1;
  code *pcVar2;
  bool bVar3;
  uint objectCount_00;
  CollectionState CVar4;
  IdleDecommitPageAllocator *pIVar5;
  LargeHeapBlock *this_00;
  ConfigFlagsTable *pCVar6;
  undefined8 *in_FS_OFFSET;
  LargeHeapBlock *heapBlock;
  char *pcStack_50;
  uint objectCount;
  size_t realPageCount;
  char *address;
  size_t pageCount;
  Segment *segment;
  Recycler *recycler;
  size_t sStack_20;
  bool nothrow_local;
  size_t size_local;
  LargeHeapBucket *this_local;
  
  segment = (Segment *)((this->super_HeapBucket).heapInfo)->recycler;
  recycler._7_1_ = nothrow;
  sStack_20 = size;
  size_local = (size_t)this;
  pcStack_50 = (char *)LargeHeapBlock::GetPagesNeeded(size,(bool)(this->supportFreeList & 1));
  address = pcStack_50;
  if (pcStack_50 == (char *)0x0) {
    if ((recycler._7_1_ & 1) == 0) {
      Recycler::OutOfMemory((Recycler *)segment);
    }
    return (LargeHeapBlock *)0x0;
  }
  realPageCount = 0;
  pIVar5 = HeapInfo::GetRecyclerLargeBlockPageAllocator((this->super_HeapBucket).heapInfo);
  realPageCount =
       (size_t)PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
               ::Alloc(&pIVar5->super_PageAllocator,(size_t *)&stack0xffffffffffffffb0,
                       (SegmentBase<Memory::VirtualAllocWrapper> **)&pageCount);
  address = pcStack_50;
  if ((char *)realPageCount == (char *)0x0) {
    return (LargeHeapBlock *)0x0;
  }
  Recycler::VerifyZeroFill((Recycler *)segment,(void *)realPageCount,(long)pcStack_50 << 0xc);
  objectCount_00 = LargeHeapBlock::GetMaxLargeObjectCount((size_t)address,sStack_20);
  this_00 = LargeHeapBlock::New((char *)realPageCount,(size_t)address,(Segment *)pageCount,
                                objectCount_00,this);
  pCVar6 = Recycler::GetRecyclerFlagsTable((Recycler *)segment);
  if ((pCVar6->Verbose & 1U) != 0) {
    pCVar6 = Recycler::GetRecyclerFlagsTable((Recycler *)segment);
    bVar3 = Js::Phases::IsEnabled(&pCVar6->Trace,MemoryAllocationPhase);
    if (!bVar3) {
      pCVar6 = Recycler::GetRecyclerFlagsTable((Recycler *)segment);
      bVar3 = Js::Phases::IsEnabled(&pCVar6->Trace,LargeMemoryAllocationPhase);
      if (!bVar3) goto LAB_00304be4;
    }
    Output::Print(L"Allocated new large heap block 0x%p for sizeCat 0x%x\n",this_00,
                  (ulong)(this->super_HeapBucket).sizeCat);
  }
LAB_00304be4:
  if (this_00 == (LargeHeapBlock *)0x0) {
    pIVar5 = HeapInfo::GetRecyclerLargeBlockPageAllocator((this->super_HeapBucket).heapInfo);
    PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
    ::SuspendIdleDecommit(&pIVar5->super_PageAllocator);
    pIVar5 = HeapInfo::GetRecyclerLargeBlockPageAllocator((this->super_HeapBucket).heapInfo);
    PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
    ::Release(&pIVar5->super_PageAllocator,(void *)realPageCount,(size_t)address,(void *)pageCount);
    pIVar5 = HeapInfo::GetRecyclerLargeBlockPageAllocator((this->super_HeapBucket).heapInfo);
    PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
    ::ResumeIdleDecommit(&pIVar5->super_PageAllocator);
    this_local = (LargeHeapBucket *)0x0;
  }
  else {
    segment[0x754].super_SegmentBaseCommon.allocator =
         (PageAllocatorBaseCommon *)
         (address + (long)segment[0x754].super_SegmentBaseCommon.allocator);
    pHVar1 = (this->super_HeapBucket).heapInfo;
    pHVar1->heapBlockCount[0xb] = pHVar1->heapBlockCount[0xb] + 1;
    this_00->heapInfo = (this->super_HeapBucket).heapInfo;
    this_00->lastCollectAllocCount = 0;
    CVar4 = ObservableValue::operator_cast_to_CollectionState
                      ((ObservableValue *)&segment->segmentPageCount);
    if (CVar4 == CollectionStateMark) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                         ,0x162,"(recycler->collectionState != CollectionStateMark)",
                         "recycler->collectionState != CollectionStateMark");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    bVar3 = HeapBlockMap64::SetHeapBlock
                      ((HeapBlockMap64 *)(segment + 1),(void *)realPageCount,(size_t)address,
                       &this_00->super_HeapBlock,LargeBlockType,'\0');
    if (bVar3) {
      LargeHeapBlock::SetNextBlock(this_00,this->largeBlockList);
      this->largeBlockList = this_00;
      this_local = (LargeHeapBucket *)this_00;
    }
    else {
      pIVar5 = HeapInfo::GetRecyclerLargeBlockPageAllocator((this->super_HeapBucket).heapInfo);
      PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
      ::SuspendIdleDecommit(&pIVar5->super_PageAllocator);
      LargeHeapBlock::ReleasePages(this_00,(Recycler *)segment);
      pIVar5 = HeapInfo::GetRecyclerLargeBlockPageAllocator((this->super_HeapBucket).heapInfo);
      PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
      ::ResumeIdleDecommit(&pIVar5->super_PageAllocator);
      LargeHeapBlock::Delete(this_00);
      pHVar1 = (this->super_HeapBucket).heapInfo;
      pHVar1->heapBlockCount[0xb] = pHVar1->heapBlockCount[0xb] - 1;
      this_local = (LargeHeapBucket *)0x0;
    }
  }
  return (LargeHeapBlock *)this_local;
}

Assistant:

LargeHeapBlock*
LargeHeapBucket::AddLargeHeapBlock(size_t size, bool nothrow)
{
    Recycler* recycler = this->heapInfo->recycler;
    Segment * segment;
    size_t pageCount = LargeHeapBlock::GetPagesNeeded(size, this->supportFreeList);
    if (pageCount == 0)
    {
        if (nothrow == false)
        {
            // overflow
            // Since nothrow is false here, it's okay to throw
            recycler->OutOfMemory();
        }

        return nullptr;
    }

    char * address = nullptr;

    size_t realPageCount = pageCount;
    address = heapInfo->GetRecyclerLargeBlockPageAllocator()->Alloc(&realPageCount, &segment);
    pageCount = realPageCount;

    if (address == nullptr)
    {
        return nullptr;
    }
#ifdef RECYCLER_ZERO_MEM_CHECK
    recycler->VerifyZeroFill(address, pageCount * AutoSystemInfo::PageSize);
#endif
    uint objectCount = LargeHeapBlock::GetMaxLargeObjectCount(pageCount, size);
    LargeHeapBlock * heapBlock = LargeHeapBlock::New(address, pageCount, segment, objectCount, this);
#if DBG
    LargeAllocationVerboseTrace(recycler->GetRecyclerFlagsTable(), _u("Allocated new large heap block 0x%p for sizeCat 0x%x\n"), heapBlock, sizeCat);
#endif

#ifdef ENABLE_JS_ETW
#if ENABLE_DEBUG_CONFIG_OPTIONS
    if (segment->GetPageCount() > heapInfo->GetRecyclerLargeBlockPageAllocator()->GetMaxAllocPageCount())
    {
        JS_ETW_INTERNAL(EventWriteJSCRIPT_INTERNAL_RECYCLER_EXTRALARGE_OBJECT_ALLOC(size));
    }
#endif
#endif
    if (!heapBlock)
    {       
        heapInfo->GetRecyclerLargeBlockPageAllocator()->SuspendIdleDecommit();
        heapInfo->GetRecyclerLargeBlockPageAllocator()->Release(address, pageCount, segment);
        heapInfo->GetRecyclerLargeBlockPageAllocator()->ResumeIdleDecommit();
        return nullptr;
    }
#if ENABLE_PARTIAL_GC
    recycler->autoHeap.uncollectedNewPageCount += pageCount;
#endif

    RECYCLER_SLOW_CHECK(this->heapInfo->heapBlockCount[HeapBlock::HeapBlockType::LargeBlockType]++);

    heapBlock->heapInfo = this->heapInfo;

    heapBlock->lastCollectAllocCount = 0;

    Assert(recycler->collectionState != CollectionStateMark);

    if (!recycler->heapBlockMap.SetHeapBlock(address, pageCount, heapBlock, HeapBlock::HeapBlockType::LargeBlockType, 0))
    {
        heapInfo->GetRecyclerLargeBlockPageAllocator()->SuspendIdleDecommit();
        heapBlock->ReleasePages(recycler);
        heapInfo->GetRecyclerLargeBlockPageAllocator()->ResumeIdleDecommit();
        LargeHeapBlock::Delete(heapBlock);
        RECYCLER_SLOW_CHECK(this->heapInfo->heapBlockCount[HeapBlock::HeapBlockType::LargeBlockType]--);
        return nullptr;
    }

    heapBlock->SetNextBlock(this->largeBlockList);
    this->largeBlockList = heapBlock;

    RECYCLER_PERF_COUNTER_ADD(FreeObjectSize, heapBlock->GetPageCount() * AutoSystemInfo::PageSize);
    return heapBlock;
}